

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_pmaps.cc
# Opt level: O1

void * v2i_POLICY_MAPPINGS(X509V3_EXT_METHOD *method,X509V3_CTX *ctx,stack_st_CONF_VALUE *nval)

{
  bool bVar1;
  OPENSSL_STACK *sk;
  size_t sVar2;
  undefined8 *puVar3;
  ASN1_VALUE *val;
  size_t sVar4;
  ASN1_OBJECT *pAVar5;
  int iVar6;
  
  sk = OPENSSL_sk_new_null();
  if (sk != (OPENSSL_STACK *)0x0) {
    sVar2 = OPENSSL_sk_num((OPENSSL_STACK *)nval);
    if (sVar2 == 0) {
      return sk;
    }
    sVar2 = 0;
    do {
      puVar3 = (undefined8 *)OPENSSL_sk_value((OPENSSL_STACK *)nval,sVar2);
      if ((puVar3[2] == 0) || (puVar3[1] == 0)) {
        iVar6 = 0x55;
LAB_0021ea67:
        bVar1 = false;
        ERR_put_error(0x14,0,0x81,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_pmaps.cc"
                      ,iVar6);
        ERR_add_error_data(6,"section:",*puVar3,",name:",puVar3[1],",value:",puVar3[2]);
        iVar6 = 5;
      }
      else {
        val = ASN1_item_new((ASN1_ITEM *)&POLICY_MAPPING_it);
        if ((val == (ASN1_VALUE *)0x0) || (sVar4 = OPENSSL_sk_push(sk,val), sVar4 == 0)) {
          ASN1_item_free(val,(ASN1_ITEM *)&POLICY_MAPPING_it);
          iVar6 = 5;
          bVar1 = false;
        }
        else {
          iVar6 = 0;
          pAVar5 = OBJ_txt2obj((char *)puVar3[1],0);
          *(ASN1_OBJECT **)val = pAVar5;
          pAVar5 = OBJ_txt2obj((char *)puVar3[2],0);
          *(ASN1_OBJECT **)(val + 8) = pAVar5;
          if ((*(long *)val == 0) || (bVar1 = true, pAVar5 == (ASN1_OBJECT *)0x0)) {
            iVar6 = 99;
            goto LAB_0021ea67;
          }
        }
      }
      if (!bVar1) goto LAB_0021eadb;
      sVar2 = sVar2 + 1;
      sVar4 = OPENSSL_sk_num((OPENSSL_STACK *)nval);
    } while (sVar2 < sVar4);
    iVar6 = 2;
LAB_0021eadb:
    if (iVar6 != 5) {
      return sk;
    }
    OPENSSL_sk_pop_free_ex(sk,sk_POLICY_MAPPING_call_free_func,POLICY_MAPPING_free);
  }
  return (void *)0x0;
}

Assistant:

static void *v2i_POLICY_MAPPINGS(const X509V3_EXT_METHOD *method,
                                 const X509V3_CTX *ctx,
                                 const STACK_OF(CONF_VALUE) *nval) {
  POLICY_MAPPINGS *pmaps = sk_POLICY_MAPPING_new_null();
  if (pmaps == NULL) {
    return NULL;
  }

  for (size_t i = 0; i < sk_CONF_VALUE_num(nval); i++) {
    const CONF_VALUE *val = sk_CONF_VALUE_value(nval, i);
    if (!val->value || !val->name) {
      OPENSSL_PUT_ERROR(X509V3, X509V3_R_INVALID_OBJECT_IDENTIFIER);
      X509V3_conf_err(val);
      goto err;
    }

    POLICY_MAPPING *pmap = POLICY_MAPPING_new();
    if (pmap == NULL || !sk_POLICY_MAPPING_push(pmaps, pmap)) {
      POLICY_MAPPING_free(pmap);
      goto err;
    }

    pmap->issuerDomainPolicy = OBJ_txt2obj(val->name, 0);
    pmap->subjectDomainPolicy = OBJ_txt2obj(val->value, 0);
    if (!pmap->issuerDomainPolicy || !pmap->subjectDomainPolicy) {
      OPENSSL_PUT_ERROR(X509V3, X509V3_R_INVALID_OBJECT_IDENTIFIER);
      X509V3_conf_err(val);
      goto err;
    }
  }
  return pmaps;

err:
  sk_POLICY_MAPPING_pop_free(pmaps, POLICY_MAPPING_free);
  return NULL;
}